

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_NonMaximumSuppression_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007494d0 == '\x01') {
    DAT_007494d0 = '\0';
    (*(code *)*_NonMaximumSuppression_PickTop_default_instance_)();
  }
  if (DAT_00749548 == '\x01') {
    DAT_00749548 = 0;
    (*(code *)*_NonMaximumSuppression_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _NonMaximumSuppression_PickTop_default_instance_.Shutdown();
  _NonMaximumSuppression_default_instance_.Shutdown();
}